

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVariableManagerGL.cpp
# Opt level: O1

PipelineResourceDesc * __thiscall
Diligent::ShaderVariableManagerGL::GetResourceDesc(ShaderVariableManagerGL *this,Uint32 Index)

{
  PipelineResourceDesc *pPVar1;
  char (*in_RCX) [13];
  string msg;
  string local_38;
  
  if ((this->super_ShaderVariableManagerBase<Diligent::EngineGLImplTraits,_void>).m_pSignature ==
      (PipelineResourceSignatureType *)0x0) {
    FormatString<char[26],char[13]>
              (&local_38,(Diligent *)"Debug expression failed:\n",(char (*) [26])"m_pSignature",
               in_RCX);
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"GetResourceDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderVariableManagerGL.cpp"
               ,0x259);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  pPVar1 = PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>::GetResourceDesc
                     (&((this->super_ShaderVariableManagerBase<Diligent::EngineGLImplTraits,_void>).
                       m_pSignature)->
                       super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>,Index);
  return pPVar1;
}

Assistant:

const PipelineResourceDesc& ShaderVariableManagerGL::GetResourceDesc(Uint32 Index) const
{
    VERIFY_EXPR(m_pSignature);
    return m_pSignature->GetResourceDesc(Index);
}